

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

void __thiscall irr::scene::CSceneManager::~CSceneManager(CSceneManager *this,void **vtt)

{
  int *piVar1;
  code *pcVar2;
  _func_int **pp_Var3;
  ICursorControl *pIVar4;
  _func_int *p_Var5;
  ISceneCollisionManager *pIVar6;
  IMeshLoader *pIVar7;
  ICameraSceneNode *pIVar8;
  IMeshCache *pIVar9;
  CAttributes *pCVar10;
  IVideoDriver *pIVar11;
  pointer ppIVar12;
  pointer pTVar13;
  pointer pDVar14;
  pointer ppIVar15;
  ulong uVar16;
  
  pp_Var3 = (_func_int **)*vtt;
  (this->super_ISceneManager)._vptr_ISceneManager = pp_Var3;
  *(void **)((long)&(this->super_ISceneManager)._vptr_ISceneManager + (long)pp_Var3[-3]) = vtt[5];
  *(void **)&(this->super_ISceneManager).field_0x8 = vtt[6];
  clearDeletionList(this);
  if (this->Driver != (IVideoDriver *)0x0) {
    (*this->Driver->_vptr_IVideoDriver[0x19])();
  }
  pIVar4 = this->CursorControl;
  if (pIVar4 != (ICursorControl *)0x0) {
    p_Var5 = pIVar4->_vptr_ICursorControl[-3];
    piVar1 = (int *)(&pIVar4->field_0x10 + (long)p_Var5);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar4->_vptr_ICursorControl + (long)p_Var5) + 8))();
    }
  }
  pIVar6 = this->CollisionManager;
  if (pIVar6 != (ISceneCollisionManager *)0x0) {
    p_Var5 = pIVar6->_vptr_ISceneCollisionManager[-3];
    piVar1 = (int *)(&pIVar6->field_0x10 + (long)p_Var5);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar6->_vptr_ISceneCollisionManager + (long)p_Var5) + 8))();
    }
  }
  ppIVar15 = (this->MeshLoaderList).m_data.
             super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->MeshLoaderList).m_data.
                          super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar15) >> 3) != 0) {
    uVar16 = 0;
    do {
      pIVar7 = ppIVar15[uVar16];
      p_Var5 = pIVar7->_vptr_IMeshLoader[0xfffffffffffffffd];
      piVar1 = (int *)(&pIVar7->field_0x10 + (long)p_Var5);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)((long)&pIVar7->_vptr_IMeshLoader + (long)p_Var5) + 8))();
      }
      uVar16 = uVar16 + 1;
      ppIVar15 = (this->MeshLoaderList).m_data.
                 super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < ((ulong)((long)(this->MeshLoaderList).m_data.
                                     super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar15) >>
                       3 & 0xffffffff));
  }
  pIVar8 = this->ActiveCamera;
  if (pIVar8 != (ICameraSceneNode *)0x0) {
    p_Var5 = (pIVar8->super_ISceneNode)._vptr_ISceneNode[-3];
    pcVar2 = (code *)((long)(pIVar8->super_ISceneNode).AbsoluteTransformation.M +
                     (long)(p_Var5 + -0x20));
    *(int *)pcVar2 = *(int *)pcVar2 + -1;
    if (*(int *)pcVar2 == 0) {
      (**(code **)(*(long *)((long)(pIVar8->super_ISceneNode).AbsoluteTransformation.M +
                            (long)(p_Var5 + -0x30)) + 8))();
    }
  }
  this->ActiveCamera = (ICameraSceneNode *)0x0;
  pIVar9 = this->MeshCache;
  if (pIVar9 != (IMeshCache *)0x0) {
    p_Var5 = pIVar9->_vptr_IMeshCache[-3];
    piVar1 = (int *)(&pIVar9->field_0x10 + (long)p_Var5);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar9->_vptr_IMeshCache + (long)p_Var5) + 8))();
    }
  }
  pCVar10 = this->Parameters;
  if (pCVar10 != (CAttributes *)0x0) {
    p_Var5 = (pCVar10->super_IAttributes)._vptr_IAttributes[-3];
    piVar1 = (int *)(&(pCVar10->super_IAttributes).field_0x10 + (long)p_Var5);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&(pCVar10->super_IAttributes)._vptr_IAttributes + (long)p_Var5) +
                  8))();
    }
  }
  (*(this->super_ISceneManager)._vptr_ISceneManager[0x28])(this);
  pIVar11 = this->Driver;
  if (pIVar11 != (IVideoDriver *)0x0) {
    p_Var5 = pIVar11->_vptr_IVideoDriver[-3];
    piVar1 = (int *)(&pIVar11->field_0x10 + (long)p_Var5);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar11->_vptr_IVideoDriver + (long)p_Var5) + 8))();
    }
  }
  ppIVar12 = (this->DeletionList).m_data.
             super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar12 != (pointer)0x0) {
    operator_delete(ppIVar12,(long)(this->DeletionList).m_data.
                                   super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar12);
  }
  ppIVar15 = (this->MeshLoaderList).m_data.
             super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar15 != (pointer)0x0) {
    operator_delete(ppIVar15,(long)(this->MeshLoaderList).m_data.
                                   super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar15);
  }
  ppIVar12 = (this->GuiNodeList).m_data.
             super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar12 != (pointer)0x0) {
    operator_delete(ppIVar12,(long)(this->GuiNodeList).m_data.
                                   super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar12);
  }
  pTVar13 = (this->TransparentEffectNodeList).m_data.
            super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar13 != (pointer)0x0) {
    operator_delete(pTVar13,(long)(this->TransparentEffectNodeList).m_data.
                                  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar13
                   );
  }
  pTVar13 = (this->TransparentNodeList).m_data.
            super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar13 != (pointer)0x0) {
    operator_delete(pTVar13,(long)(this->TransparentNodeList).m_data.
                                  super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar13
                   );
  }
  pDVar14 = (this->SolidNodeList).m_data.
            super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pDVar14 != (pointer)0x0) {
    operator_delete(pDVar14,(long)(this->SolidNodeList).m_data.
                                  super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar14
                   );
  }
  ppIVar12 = (this->SkyBoxList).m_data.
             super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar12 != (pointer)0x0) {
    operator_delete(ppIVar12,(long)(this->SkyBoxList).m_data.
                                   super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar12);
  }
  ppIVar12 = (this->CameraList).m_data.
             super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar12 != (pointer)0x0) {
    operator_delete(ppIVar12,(long)(this->CameraList).m_data.
                                   super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppIVar12);
  }
  ISceneNode::~ISceneNode((ISceneNode *)&(this->super_ISceneManager).field_0x8,vtt + 3);
  return;
}

Assistant:

CSceneManager::~CSceneManager()
{
	clearDeletionList();

	//! force to remove hardwareTextures from the driver
	//! because Scenes may hold internally data bounded to sceneNodes
	//! which may be destroyed twice
	if (Driver)
		Driver->removeAllHardwareBuffers();

	if (CursorControl)
		CursorControl->drop();

	if (CollisionManager)
		CollisionManager->drop();

	u32 i;
	for (i = 0; i < MeshLoaderList.size(); ++i)
		MeshLoaderList[i]->drop();

	if (ActiveCamera)
		ActiveCamera->drop();
	ActiveCamera = 0;

	if (MeshCache)
		MeshCache->drop();

	if (Parameters)
		Parameters->drop();

	// remove all nodes before dropping the driver
	// as render targets may be destroyed twice

	removeAll();

	if (Driver)
		Driver->drop();
}